

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

CallbackInfo * __thiscall
Js::DynamicProfileInfo::EnsureCallbackInfo
          (DynamicProfileInfo *this,FunctionBody *funcBody,ProfileId callSiteId)

{
  bool bVar1;
  ScriptContext *pSVar2;
  Recycler *pRVar3;
  WriteBarrierPtr *this_00;
  CallbackInfo **ppCVar4;
  TrackAllocData local_b8;
  DynamicProfileInfo *local_90;
  CallbackInfo *info;
  EditingIterator iter;
  TrackAllocData local_60;
  Recycler *local_38;
  Recycler *recycler;
  CallbackInfoList *list;
  FunctionBody *pFStack_20;
  ProfileId callSiteId_local;
  FunctionBody *funcBody_local;
  DynamicProfileInfo *this_local;
  
  list._6_2_ = callSiteId;
  pFStack_20 = funcBody;
  funcBody_local = (FunctionBody *)this;
  recycler = (Recycler *)FunctionBody::GetCallbackInfoList(funcBody);
  if (recycler == (Recycler *)0x0) {
    pSVar2 = FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_20);
    pRVar3 = ScriptContext::GetRecycler(pSVar2);
    local_38 = pRVar3;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&SList<Js::CallbackInfo*,Memory::Recycler,RealCount>::typeinfo
               ,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
               ,0x20c);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_60);
    iter.super_EditingIterator.last = (NodeBase *)Memory::Recycler::AllocInlined;
    pRVar3 = (Recycler *)new<Memory::Recycler>(0x18,pRVar3,0x43c4b0);
    SList<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::SList
              ((SList<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)pRVar3,local_38);
    recycler = pRVar3;
    FunctionBody::SetCallbackInfoList(pFStack_20,(CallbackInfoList *)pRVar3);
  }
  TryFindCallbackInfoIterator((EditingIterator *)&info,(CallbackInfoList *)recycler,list._6_2_);
  bVar1 = SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::Iterator::IsValid
                    ((Iterator *)&info);
  if (bVar1) {
    this_00 = (WriteBarrierPtr *)
              SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                        ((Iterator *)&info);
    ppCVar4 = Memory::WriteBarrierPtr::operator_cast_to_CallbackInfo__(this_00);
    this_local = (DynamicProfileInfo *)*ppCVar4;
  }
  else {
    pSVar2 = FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_20);
    pRVar3 = ScriptContext::GetRecycler(pSVar2);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b8,(type_info *)&CallbackInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
               ,0x217);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_b8);
    local_90 = (DynamicProfileInfo *)new<Memory::Recycler>(0xc,pRVar3,0x744a10);
    *(ProfileId *)((long)&(local_90->dynamicProfileFunctionInfo).ptr + 2) = list._6_2_;
    *(undefined4 *)((long)&(local_90->dynamicProfileFunctionInfo).ptr + 4) = 0xffffffff;
    *(byte *)&(local_90->dynamicProfileFunctionInfo).ptr =
         *(byte *)&(local_90->dynamicProfileFunctionInfo).ptr & 0xfe | 1;
    SList<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::InsertBefore
              ((EditingIterator *)&info,(CallbackInfo **)&local_90);
    this_local = local_90;
  }
  return (CallbackInfo *)this_local;
}

Assistant:

CallbackInfo * DynamicProfileInfo::EnsureCallbackInfo(FunctionBody * funcBody, ProfileId callSiteId)
    {
        CallbackInfoList * list = funcBody->GetCallbackInfoList();
        if (list == nullptr)
        {
            Recycler * recycler = funcBody->GetScriptContext()->GetRecycler();
            list = RecyclerNew(recycler, CallbackInfoList, recycler);
            funcBody->SetCallbackInfoList(list);
        }

        CallbackInfoList::EditingIterator iter = TryFindCallbackInfoIterator(list, callSiteId);
        if (iter.IsValid())
        {
            return iter.Data();
        }

        // Callsite is not already in the list, so add it to the end.
        CallbackInfo * info = info = RecyclerNewStructZ(funcBody->GetScriptContext()->GetRecycler(), CallbackInfo);
        info->callSiteId = callSiteId;
        info->sourceId = NoSourceId;
        info->canInlineCallback = true;

        iter.InsertBefore(info);
        return info;
    }